

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O0

size_t ZSTD_initDDict_internal
                 (ZSTD_DDict *ddict,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  uint uVar1;
  void *__dest;
  size_t err_code;
  void *internalBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DDict *ddict_local;
  
  _dictContentType_local = dictSize;
  if (((dictLoadMethod == ZSTD_dlm_byRef) || (dict == (void *)0x0)) || (dictSize == 0)) {
    ddict->dictBuffer = (void *)0x0;
    ddict->dictContent = dict;
    if (dict == (void *)0x0) {
      _dictContentType_local = 0;
    }
  }
  else {
    __dest = ZSTD_customMalloc(dictSize,ddict->cMem);
    ddict->dictBuffer = __dest;
    ddict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dict,dictSize);
  }
  ddict->dictSize = _dictContentType_local;
  (ddict->entropy).hufTable[0] = 0xc00000c;
  ddict_local = (ZSTD_DDict *)ZSTD_loadEntropy_intoDDict(ddict,dictContentType);
  uVar1 = ERR_isError((size_t)ddict_local);
  if (uVar1 == 0) {
    ddict_local = (ZSTD_DDict *)0x0;
  }
  return (size_t)ddict_local;
}

Assistant:

static size_t ZSTD_initDDict_internal(ZSTD_DDict* ddict,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType)
{
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dict) || (!dictSize)) {
        ddict->dictBuffer = NULL;
        ddict->dictContent = dict;
        if (!dict) dictSize = 0;
    } else {
        void* const internalBuffer = ZSTD_customMalloc(dictSize, ddict->cMem);
        ddict->dictBuffer = internalBuffer;
        ddict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        ZSTD_memcpy(internalBuffer, dict, dictSize);
    }
    ddict->dictSize = dictSize;
    ddict->entropy.hufTable[0] = (HUF_DTable)((ZSTD_HUFFDTABLE_CAPACITY_LOG)*0x1000001);  /* cover both little and big endian */

    /* parse dictionary content */
    FORWARD_IF_ERROR( ZSTD_loadEntropy_intoDDict(ddict, dictContentType) , "");

    return 0;
}